

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

void canvas_saved(_glist *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  _glist *local_30;
  t_gobj *g;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  _glist *x_local;
  
  for (local_30 = (_glist *)x->gl_list; local_30 != (_glist *)0x0;
      local_30 = (_glist *)(local_30->gl_obj).te_g.g_next) {
    if ((local_30->gl_obj).te_g.g_pd == savestate_class) {
      outlet_list((_outlet *)local_30->gl_list,(t_symbol *)0x0,argc,argv);
    }
    else if (((local_30->gl_obj).te_g.g_pd == canvas_class) &&
            (iVar1 = canvas_isabstraction(local_30), iVar1 == 0)) {
      canvas_saved(local_30,s,argc,argv);
    }
  }
  return;
}

Assistant:

void canvas_saved(t_glist *x, t_symbol *s, int argc, t_atom *argv)
{
    t_gobj *g;
    for (g = x->gl_list; g; g = g->g_next)
        if (g->g_pd == savestate_class)
            outlet_list(((t_savestate *)g)->x_stateout, 0, argc, argv);
        else if (g->g_pd == canvas_class && !canvas_isabstraction((t_canvas *)g))
            canvas_saved((t_glist *)g, s, argc, argv);
}